

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O1

void operations_test<viennamath::ct_constant<7l>,viennamath::ct_constant<5l>>
               (ct_constant<7L> *t,ct_constant<5L> *u,double t2,double u2)

{
  ostream *poVar1;
  ct_constant<35L> local_3e;
  ct_constant<35L> local_3d;
  ct_constant<_2L> local_3c;
  ct_constant<2L> local_3b;
  ct_constant<12L> local_3a;
  ct_constant<12L> local_39;
  double local_38;
  double local_30;
  double local_28;
  ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>
  local_1c;
  ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_div<double>,_viennamath::ct_constant<5L>_>
  local_1a;
  
  local_38 = t2;
  local_30 = u2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"LHS: ",5);
  poVar1 = viennamath::operator<<((ostream *)&std::cout,t);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", RHS: ",7);
  poVar1 = viennamath::operator<<(poVar1,u);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_28 = local_38 + local_30;
  evaluations_test<viennamath::ct_constant<12l>>(&local_39,local_28);
  evaluations_test<viennamath::ct_constant<12l>>(&local_3a,local_28);
  evaluations_test<viennamath::ct_constant<2l>>(&local_3b,local_38 - local_30);
  evaluations_test<viennamath::ct_constant<_2l>>(&local_3c,local_30 - local_38);
  local_28 = local_38 * local_30;
  evaluations_test<viennamath::ct_constant<35l>>(&local_3d,local_28);
  evaluations_test<viennamath::ct_constant<35l>>(&local_3e,local_28);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_div<double>,viennamath::ct_constant<5l>>>
            (&local_1a,local_38 / local_30);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_div<double>,viennamath::ct_constant<7l>>>
            (&local_1c,local_30 / local_38);
  return;
}

Assistant:

void operations_test(T const & t, U const & u, double t2, double u2)
{
  std::cout << "LHS: " << t << ", RHS: " << u << std::endl;
  evaluations_test(t + u, t2 + u2);
  evaluations_test(u + t, u2 + t2);
  evaluations_test(t - u, t2 - u2);
  evaluations_test(u - t, u2 - t2);
  evaluations_test(t * u, t2 * u2);
  evaluations_test(u * t, u2 * t2);
  evaluations_test(t / u, t2 / u2);
  evaluations_test(u / t, u2 / t2);
}